

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O0

void __thiscall
ncnn::Unfold::make_padding(Unfold *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  void *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  int kernel_extent_h;
  int kernel_extent_w;
  int h;
  int w;
  undefined8 *in_stack_fffffffffffffeb0;
  float v;
  undefined8 *puVar2;
  Mat *in_stack_fffffffffffffec8;
  Mat *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee0;
  Option *in_stack_fffffffffffffee8;
  undefined1 local_f0 [8];
  undefined8 local_e8;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [8];
  undefined8 local_a0;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  void *local_58;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 *local_20;
  int local_18;
  undefined4 local_14;
  void *local_8;
  
  local_5c = *(int *)((long)in_RSI + 0x2c);
  local_60 = *(int *)(in_RSI + 6);
  local_64 = *(int *)(in_RDI + 0xd8) * (*(int *)(in_RDI + 0xd0) + -1) + 1;
  local_68 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_58 = in_RCX;
  local_20 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != 0) {
      piVar1 = (int *)in_RSI[1];
      local_34 = 1;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar2 = in_RDX;
    local_30 = in_RSI;
    if (in_RDX[1] != 0) {
      piVar1 = (int *)in_RDX[1];
      local_14 = 0xffffffff;
      LOCK();
      local_18 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_18 == 1) {
        if (in_RDX[4] == 0) {
          local_8 = (void *)*in_RDX;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = 0;
    in_RDX[2] = 0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = 0;
    in_RDX[1] = 0;
    *puVar2 = *local_30;
    puVar2[1] = local_30[1];
    puVar2[2] = local_30[2];
    *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(local_30 + 3);
    puVar2[4] = local_30[4];
    *(undefined4 *)(puVar2 + 5) = *(undefined4 *)(local_30 + 5);
    *(undefined4 *)((long)puVar2 + 0x2c) = *(undefined4 *)((long)local_30 + 0x2c);
    *(undefined4 *)(puVar2 + 6) = *(undefined4 *)(local_30 + 6);
    *(undefined4 *)((long)puVar2 + 0x34) = *(undefined4 *)((long)local_30 + 0x34);
    *(undefined4 *)(puVar2 + 7) = *(undefined4 *)(local_30 + 7);
    puVar2[8] = local_30[8];
    in_stack_fffffffffffffeb0 = in_RDX;
    local_20 = puVar2;
  }
  v = (float)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  if ((((*(int *)(in_RDI + 0xe8) < 1) && (*(int *)(in_RDI + 0xec) < 1)) &&
      (*(int *)(in_RDI + 0xf0) < 1)) && (*(int *)(in_RDI + 0xf4) < 1)) {
    if (((*(int *)(in_RDI + 0xe8) == -0xe9) && (*(int *)(in_RDI + 0xec) == -0xe9)) &&
       ((*(int *)(in_RDI + 0xf0) == -0xe9 && (*(int *)(in_RDI + 0xf4) == -0xe9)))) {
      local_ac = (local_64 + ((local_5c + -1) / *(int *)(in_RDI + 0xe0)) * *(int *)(in_RDI + 0xe0))
                 - local_5c;
      local_b0 = (local_68 + ((local_60 + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4))
                 - local_60;
      if ((0 < local_ac) || (0 < local_b0)) {
        memcpy(local_f0,local_58,0x40);
        local_e8 = *(undefined8 *)((long)local_58 + 0x10);
        copy_make_border(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                         (int)in_RDI,in_stack_fffffffffffffee0,v,in_stack_fffffffffffffee8);
      }
    }
    else if (((*(int *)(in_RDI + 0xe8) == -0xea) && (*(int *)(in_RDI + 0xec) == -0xea)) &&
            ((*(int *)(in_RDI + 0xf0) == -0xea &&
             ((*(int *)(in_RDI + 0xf4) == -0xea &&
              ((0 < (local_64 +
                    ((local_5c + -1) / *(int *)(in_RDI + 0xe0)) * *(int *)(in_RDI + 0xe0)) -
                    local_5c ||
               (0 < (local_68 +
                    ((local_60 + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4)) -
                    local_60)))))))) {
      memcpy(&stack0xfffffffffffffec8,local_58,0x40);
      copy_make_border(*(Mat **)((long)local_58 + 0x10),in_stack_fffffffffffffec8,
                       (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                       (int)in_RDI,in_stack_fffffffffffffee0,v,in_stack_fffffffffffffee8);
    }
  }
  else {
    memcpy(local_a8,local_58,0x40);
    local_a0 = *(undefined8 *)((long)local_58 + 0x10);
    copy_make_border(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (int)((ulong)local_20 >> 0x20),(int)local_20,(int)((ulong)in_RDI >> 0x20),
                     (int)in_RDI,in_stack_fffffffffffffee0,v,in_stack_fffffffffffffee8);
  }
  return;
}

Assistant:

void Unfold::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}